

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

hts_idx_t * bam_index(BGZF *fp,int min_shift)

{
  int iVar1;
  bam_hdr_t *h_00;
  hts_idx_t *idx_00;
  bam1_t *b_00;
  int local_54;
  int ret;
  int l;
  int64_t s;
  int64_t max_len;
  bam_hdr_t *h;
  hts_idx_t *idx;
  bam1_t *b;
  int fmt;
  int i;
  int n_lvls;
  int min_shift_local;
  BGZF *fp_local;
  
  h_00 = bam_hdr_read(fp);
  if (min_shift < 1) {
    i = 0xe;
    fmt = 5;
    b._0_4_ = 1;
  }
  else {
    s = 0;
    for (b._4_4_ = 0; b._4_4_ < h_00->n_targets; b._4_4_ = b._4_4_ + 1) {
      if ((ulong)s < (ulong)h_00->target_len[b._4_4_]) {
        s = (int64_t)h_00->target_len[b._4_4_];
      }
    }
    fmt = 0;
    for (_ret = (long)(1 << ((byte)min_shift & 0x1f)); _ret < s + 0x100; _ret = _ret << 3) {
      fmt = fmt + 1;
    }
    b._0_4_ = 0;
    i = min_shift;
  }
  idx_00 = hts_idx_init(h_00->n_targets,(int)b,
                        fp->block_address << 0x10 | (long)(int)(fp->block_offset & 0xffff),i,fmt);
  bam_hdr_destroy(h_00);
  b_00 = bam_init1();
  do {
    iVar1 = bam_read1(fp,b_00);
    if (iVar1 < 0) {
      hts_idx_finish(idx_00,fp->block_address << 0x10 | (long)(int)(fp->block_offset & 0xffff));
      bam_destroy1(b_00);
      return idx_00;
    }
    local_54 = bam_cigar2rlen((uint)(ushort)((ulong)*(undefined8 *)&(b_00->core).field_0x8 >> 0x30),
                              (uint32_t *)
                              (b_00->data +
                              (int)((uint)((ulong)*(undefined8 *)&(b_00->core).field_0x8 >> 0x18) &
                                   0xff)));
    if (local_54 == 0) {
      local_54 = 1;
    }
    iVar1 = hts_idx_push(idx_00,(b_00->core).tid,(b_00->core).pos,(b_00->core).pos + local_54,
                         fp->block_address << 0x10 | (long)(int)(fp->block_offset & 0xffff),
                         (uint)(((*(ulong *)&(b_00->core).field_0x8 & 0x400000000) != 0 ^ 0xffU) & 1
                               ));
  } while (-1 < iVar1);
  bam_destroy1(b_00);
  hts_idx_destroy(idx_00);
  return (hts_idx_t *)0x0;
}

Assistant:

static hts_idx_t *bam_index(BGZF *fp, int min_shift)
{
    int n_lvls, i, fmt;
    bam1_t *b;
    hts_idx_t *idx;
    bam_hdr_t *h;
    h = bam_hdr_read(fp);
    if (min_shift > 0) {
        int64_t max_len = 0, s;
        for (i = 0; i < h->n_targets; ++i)
            if (max_len < h->target_len[i]) max_len = h->target_len[i];
        max_len += 256;
        for (n_lvls = 0, s = 1<<min_shift; max_len > s; ++n_lvls, s <<= 3);
        fmt = HTS_FMT_CSI;
    } else min_shift = 14, n_lvls = 5, fmt = HTS_FMT_BAI;
    idx = hts_idx_init(h->n_targets, fmt, bgzf_tell(fp), min_shift, n_lvls);
    bam_hdr_destroy(h);
    b = bam_init1();
    while (bam_read1(fp, b) >= 0) {
        int l, ret;
        l = bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b));
        if (l == 0) l = 1; // no zero-length records
        ret = hts_idx_push(idx, b->core.tid, b->core.pos, b->core.pos + l, bgzf_tell(fp), !(b->core.flag&BAM_FUNMAP));
        if (ret < 0)
        {
            // unsorted
            bam_destroy1(b);
            hts_idx_destroy(idx);
            return NULL;
        }
    }
    hts_idx_finish(idx, bgzf_tell(fp));
    bam_destroy1(b);
    return idx;
}